

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

char * ndiCommandVA(ndicapi *api,char *format,__va_list_tag *ap)

{
  char *pol;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long uVar5;
  bool local_6c;
  bool local_6b;
  unsigned_short replyCrc;
  int data_1;
  bool isThreadMode;
  bool isBinary;
  int data;
  int iStack_54;
  unsigned_short CRC16;
  int errorCode_1;
  int errorCode;
  char *commandReply;
  char *reply;
  char *command;
  bool inCommand;
  int iStack_30;
  bool useCrc;
  int commandLength;
  int bytes;
  int i;
  __va_list_tag *ap_local;
  char *format_local;
  ndicapi *api_local;
  
  command._3_1_ = 0;
  command._2_1_ = 1;
  iStack_54 = 0;
  reply = api->Command;
  commandReply = api->Reply;
  _errorCode_1 = (ndicapi *)api->ReplyNoCRC;
  command._4_4_ = 0;
  api->ErrorCode = 0;
  *reply = '\0';
  *commandReply = '\0';
  *(char *)&_errorCode_1->SerialDevice = '\0';
  _bytes = ap;
  ap_local = (__va_list_tag *)format;
  format_local = (char *)api;
  if (((api->SerialDevice == -1) && (api->Hostname == (char *)0x0)) && (api->Port < 0)) {
    anon_unknown.dwarf_ac3::ndiSetError(api,0x101);
    api_local = _errorCode_1;
  }
  else if (format == (char *)0x0) {
    if (((api->IsThreadedMode & 1U) != 0) && ((api->IsTracking & 1U) != 0)) {
      ndiMutexLock(api->ThreadMutex);
    }
    format_local[0x38] = '\0';
    if (*(int *)format_local == -1) {
      iStack_30 = ndiSocketRead(*(NDISocketHandle *)(format_local + 0x10),commandReply,0x7ff,false,
                                &data);
    }
    else {
      ndiSerialComm(*(int *)format_local,0x2580,"8N1",0);
      ndiSerialFlush(*(int *)format_local,3);
      ndiSerialBreak(*(int *)format_local);
      iStack_30 = ndiSerialRead(*(int *)format_local,commandReply,0x7ff,false,
                                &stack0xffffffffffffffac);
    }
    iVar2 = strncmp(commandReply,"RESETBE6F\r",8);
    if (iVar2 == 0) {
      commandReply[iStack_30] = '\0';
      iStack_30 = iStack_30 + -5;
      strncpy((char *)_errorCode_1,commandReply,(long)iStack_30);
      *(char *)((long)&_errorCode_1->SerialDevice + (long)iStack_30) = '\0';
      api_local = _errorCode_1;
    }
    else {
      anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,0x106);
      api_local = _errorCode_1;
    }
  }
  else {
    vsprintf(reply,format,ap);
    _isThreadMode = 0;
    for (commandLength = 0; reply[commandLength] != '\0'; commandLength = commandLength + 1) {
      uVar3 = (int)reply[commandLength] ^ _isThreadMode & 0xff;
      uVar4 = uVar3 & 0xff;
      _isThreadMode = _isThreadMode >> 8;
      if (oddparity[(int)(uVar3 & 0xf)] != oddparity[(int)uVar4 >> 4]) {
        _isThreadMode = _isThreadMode ^ 0xc001;
      }
      _isThreadMode = _isThreadMode ^ (ushort)(uVar4 << 6) ^ (ushort)(uVar4 << 7);
      if (((command._2_1_ & 1) != 0) && (reply[commandLength] == ':')) {
        command._3_1_ = 1;
      }
      if ((((command._2_1_ & 1) != 0) &&
          ((reply[commandLength] < 'A' || ('Z' < reply[commandLength])))) &&
         ((reply[commandLength] < '0' || ('9' < reply[commandLength])))) {
        command._2_1_ = 0;
        command._4_4_ = commandLength;
      }
    }
    if ((command._2_1_ & 1) != 0) {
      command._4_4_ = commandLength;
    }
    if ((command._3_1_ & 1) != 0) {
      sprintf(reply + commandLength,"%04X",(ulong)_isThreadMode);
      commandLength = commandLength + 4;
    }
    reply[commandLength] = '\r';
    reply[commandLength + 1] = '\0';
    commandLength = commandLength + 1;
    iVar2 = strncmp(reply,"BX",(long)command._4_4_);
    if (((iVar2 != 0) || (local_6b = true, command._4_4_ != 2)) &&
       ((iVar2 = strncmp(reply,"GETLOG",(long)command._4_4_), iVar2 != 0 ||
        (local_6b = true, command._4_4_ != 6)))) {
      iVar2 = strncmp(reply,"VGET",(long)command._4_4_);
      local_6c = iVar2 == 0 && command._4_4_ == 4;
      local_6b = local_6c;
    }
    if (((((format_local[0x39] & 1U) == 0) || ((format_local[0x38] & 1U) == 0)) ||
        (command._4_4_ != 2)) ||
       (((*reply != 'G' || (reply[1] != 'X')) &&
        (((*reply != 'T' || (reply[1] != 'X')) && ((*reply != 'B' || (reply[1] != 'X')))))))) {
      bVar1 = format_local[0x39] & 1;
      if ((bVar1 != 0) && ((format_local[0x38] & 1U) != 0)) {
        ndiMutexLock(*(pthread_mutex_t **)(format_local + 0x48));
      }
      if (((command._4_4_ == 5) && (iVar2 = strncmp(reply,"TSTOP",5), iVar2 == 0)) ||
         ((command._4_4_ == 4 && (iVar2 = strncmp(reply,"INIT",4), iVar2 == 0)))) {
        format_local[0x38] = '\0';
      }
      else if (((command._4_4_ == 6) && (iVar2 = strncmp(reply,"TSTART",6), iVar2 == 0)) &&
              (format_local[0x38] = '\x01', bVar1 != 0)) {
        **(undefined1 **)(format_local + 0x60) = 0;
      }
      if (*(int *)format_local == -1) {
        ndiSocketFlush(*(NDISocketHandle *)(format_local + 0x10),1);
      }
      else {
        ndiSerialFlush(*(int *)format_local,1);
      }
      if (*(int *)format_local == -1) {
        iStack_30 = ndiSocketWrite(*(NDISocketHandle *)(format_local + 0x10),reply,commandLength);
      }
      else {
        iStack_30 = ndiSerialWrite(*(int *)format_local,reply,commandLength);
      }
      if (iStack_30 < 0) {
        iStack_54 = 0x104;
      }
      else if (iStack_30 < commandLength) {
        iStack_54 = 0x103;
      }
      iStack_30 = 0;
      if (iStack_54 == 0) {
        if (*(int *)format_local == -1) {
          iStack_30 = ndiSocketRead(*(NDISocketHandle *)(format_local + 0x10),commandReply,0x7ff,
                                    local_6b,&stack0xffffffffffffffac);
        }
        else {
          iStack_30 = ndiSerialRead(*(int *)format_local,commandReply,0x7ff,local_6b,
                                    &stack0xffffffffffffffac);
        }
        if (iStack_30 < 0) {
          iStack_54 = 0x105;
          iStack_30 = 0;
        }
        else if (iStack_30 == 0) {
          iStack_54 = 0x103;
        }
        if (local_6b == false) {
          commandReply[iStack_30] = '\0';
        }
      }
      if ((bVar1 & format_local[0x38] & 1U) != 0) {
        ndiMutexUnlock(*(pthread_mutex_t **)(format_local + 0x48));
      }
      if (iStack_54 != 0) {
        anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,iStack_54);
        return (char *)_errorCode_1;
      }
    }
    else {
      iVar2 = strcmp(reply,*(char **)(format_local + 0x60));
      if (iVar2 != 0) {
        ndiMutexLock(*(pthread_mutex_t **)(format_local + 0x48));
        strcpy(*(char **)(format_local + 0x60),reply);
        format_local[0x78] = *reply == 'B';
        ndiMutexUnlock(*(pthread_mutex_t **)(format_local + 0x48));
        iVar2 = ndiEventWait(*(pl_cond_and_mutex_t **)(format_local + 0x58),5000);
        if (iVar2 != 0) {
          anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,0x103);
          return (char *)_errorCode_1;
        }
      }
      iVar2 = ndiEventWait(*(pl_cond_and_mutex_t **)(format_local + 0x58),5000);
      if (iVar2 != 0) {
        anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,0x103);
        return (char *)_errorCode_1;
      }
      ndiMutexLock(*(pthread_mutex_t **)(format_local + 0x50));
      for (iStack_30 = 0; *(char *)(*(long *)(format_local + 0x70) + (long)iStack_30) != '\0';
          iStack_30 = iStack_30 + 1) {
        commandReply[iStack_30] = *(char *)(*(long *)(format_local + 0x70) + (long)iStack_30);
      }
      if (local_6b == false) {
        commandReply[iStack_30] = '\0';
      }
      iStack_54 = *(int *)(format_local + 0x7c);
      ndiMutexUnlock(*(pthread_mutex_t **)(format_local + 0x50));
      if (iStack_54 != 0) {
        anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,iStack_54);
        return (char *)_errorCode_1;
      }
    }
    if (local_6b == false) {
      iStack_30 = iStack_30 + -5;
    }
    else {
      iStack_30 = iStack_30 + -2;
    }
    if (iStack_30 < 0) {
      anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,0x100);
      api_local = _errorCode_1;
    }
    else {
      _isThreadMode = 0;
      for (commandLength = 0; commandLength < iStack_30; commandLength = commandLength + 1) {
        uVar3 = (int)commandReply[commandLength] ^ _isThreadMode & 0xff;
        uVar4 = uVar3 & 0xff;
        _isThreadMode = _isThreadMode >> 8;
        if (oddparity[(int)(uVar3 & 0xf)] != oddparity[(int)uVar4 >> 4]) {
          _isThreadMode = _isThreadMode ^ 0xc001;
        }
        _isThreadMode = _isThreadMode ^ (ushort)(uVar4 << 6) ^ (ushort)(uVar4 << 7);
        *(char *)((long)&_errorCode_1->SerialDevice + (long)commandLength) =
             commandReply[commandLength];
      }
      if (local_6b == false) {
        *(char *)((long)&_errorCode_1->SerialDevice + (long)commandLength) = '\0';
      }
      if (iStack_54 == 0) {
        if (local_6b == false) {
          uVar5 = ndiHexToUnsignedLong(commandReply + iStack_30,4);
          if (_isThreadMode != uVar5) {
            anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,0x100);
            return (char *)_errorCode_1;
          }
        }
        else if (CONCAT11(commandReply[iStack_30 + 1],commandReply[iStack_30]) != _isThreadMode) {
          anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)format_local,0x100);
          return (char *)_errorCode_1;
        }
        if (((char)_errorCode_1->SerialDevice == 'E') &&
           (iVar2 = strncmp((char *)_errorCode_1,"ERROR",5), pol = format_local, iVar2 == 0)) {
          uVar5 = ndiHexToUnsignedLong(&_errorCode_1->field_0x5,2);
          anon_unknown.dwarf_ac3::ndiSetError((ndicapi *)pol,(int)uVar5);
          api_local = _errorCode_1;
        }
        else {
          if ((*reply == 'T') && ((reply[1] == 'X' && (command._4_4_ == 2)))) {
            anon_unknown.dwarf_ac3::ndiTXHelper((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'B') && ((reply[1] == 'X' && (command._4_4_ == 2)))) {
            anon_unknown.dwarf_ac3::ndiBXHelper((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'G') && ((reply[1] == 'X' && (command._4_4_ == 2)))) {
            anon_unknown.dwarf_ac3::ndiGXHelper((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'C') &&
                  ((command._4_4_ == 4 && (iVar2 = strncmp(reply,"COMM",4), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiCOMMHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'I') &&
                  ((command._4_4_ == 4 && (iVar2 = strncmp(reply,"INIT",4), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiINITHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'I') &&
                  ((command._4_4_ == 5 && (iVar2 = strncmp(reply,"IRCHK",5), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiIRCHKHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'P') &&
                  ((command._4_4_ == 5 && (iVar2 = strncmp(reply,"PHINF",5), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiPHINFHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'P') &&
                  ((command._4_4_ == 4 && (iVar2 = strncmp(reply,"PHRQ",4), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiPHRQHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'P') &&
                  ((command._4_4_ == 4 && (iVar2 = strncmp(reply,"PHSR",4), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiPHSRHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'P') &&
                  ((command._4_4_ == 5 && (iVar2 = strncmp(reply,"PSTAT",5), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiPSTATHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          else if ((*reply == 'S') &&
                  ((command._4_4_ == 5 && (iVar2 = strncmp(reply,"SSTAT",5), iVar2 == 0)))) {
            anon_unknown.dwarf_ac3::ndiSSTATHelper
                      ((ndicapi *)format_local,reply,(char *)_errorCode_1);
          }
          api_local = _errorCode_1;
        }
      }
      else {
        api_local = _errorCode_1;
      }
    }
  }
  return (char *)api_local;
}

Assistant:

ndicapiExport char* ndiCommandVA(ndicapi* api, const char* format, va_list ap)
{
  int i, bytes, commandLength;
  bool useCrc = false;
  bool inCommand = true;
  char* command;
  char* reply;
  char* commandReply;
  int errorCode = 0;

  command = api->Command;       // text sent to ndicapi
  reply = api->Reply;     // text received from ndicapi
  commandReply = api->ReplyNoCRC;   // received text, with CRC hacked off
  commandLength = 0;                  // length of 'command' part of command

  api->ErrorCode = 0;                 // clear error
  command[0] = '\0';
  reply[0] = '\0';
  commandReply[0] = '\0';

  // verify that the serial device was opened
  if (api->SerialDevice == NDI_INVALID_HANDLE && api->Hostname == NULL && api->Port < 0)
  {
    ndiSetError(api, NDI_OPEN_ERROR);
    return commandReply;
  }

  // if the command is NULL, send a break to reset the Measurement System
  if (format == NULL)
  {
    if (api->IsThreadedMode && api->IsTracking)
    {
      // block the tracking thread
      ndiMutexLock(api->ThreadMutex);
    }
    api->IsTracking = false;

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      ndiSerialComm(api->SerialDevice, 9600, "8N1", 0);
      ndiSerialFlush(api->SerialDevice, NDI_IOFLUSH);
      ndiSerialBreak(api->SerialDevice);
      bytes = ndiSerialRead(api->SerialDevice, reply, 2047, false, &errorCode);
    }
    else
    {
      int errorCode;
      bytes = ndiSocketRead(api->Socket, reply, 2047, false, &errorCode);
    }

    // check for correct reply
    if (strncmp(reply, "RESETBE6F\r", 8) != 0)
    {
      ndiSetError(api, NDI_RESET_FAIL);
      return commandReply;
    }

    // terminate the reply string
    reply[bytes] = '\0';
    bytes -= 5;
    strncpy(commandReply, reply, bytes);
    commandReply[bytes] = '\0';

    // return the reply string, minus the CRC
    return commandReply;
  }

  vsprintf(command, format, ap);                    // format parameters

  unsigned short CRC16 = 0;                         // calculate CRC
  for (i = 0; command[i] != '\0'; i++)
  {
    CalcCRC16(command[i], &CRC16);
    if (inCommand && command[i] == ':')             // only use CRC if a ':'
    {
      useCrc = true;                                //  follows the command
    }
    if (inCommand && !((command[i] >= 'A' && command[i] <= 'Z') ||
                       (command[i] >= '0' && command[i] <= '9')))
    {
      inCommand = false;                            // 'command' part has ended
      commandLength = i;                            // command length
    }
  }
  if (inCommand)
  {
    // Command was sent with no ':'
    // Example, ndiCommand("INIT");
    commandLength = i;
  }

  if (useCrc)
  {
    sprintf(&command[i], "%04X", CRC16);            // tack on the CRC
    i += 4;
  }

  command[i++] = '\r';                              // tack on carriage return
  command[i] = '\0';                                // terminate for good luck

  bool isBinary = (strncmp(command, "BX", commandLength) == 0 && commandLength == strlen("BX") ||
                   strncmp(command, "GETLOG", commandLength) == 0 && commandLength == strlen("GETLOG") ||
                   strncmp(command, "VGET", commandLength) == 0 && commandLength == strlen("VGET"));


  // if the command is GX, TX, or BX and thread_mode is on, we copy the reply from
  //  the thread rather than getting it directly from the Measurement System
  if (api->IsThreadedMode && api->IsTracking &&
      commandLength == 2 && (command[0] == 'G' && command[1] == 'X' ||
                             command[0] == 'T' && command[1] == 'X' ||
                             command[0] == 'B' && command[1] == 'X'))
  {
    // check that the thread is sending the GX/BX/TX command that we want
    if (strcmp(command, api->ThreadCommand) != 0)
    {
      // tell thread to start using the new GX/BX/TX command
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand, command);
      api->IsThreadedCommandBinary = (command[0] == 'B');
      ndiMutexUnlock(api->ThreadMutex);
      // wait for the next data record to arrive (we have to throw it away)
      if (ndiEventWait(api->ThreadBufferEvent, 5000))
      {
        ndiSetError(api, NDI_TIMEOUT);
        return commandReply;
      }
    }
    // there is usually no wait, because usually new data is ready
    if (ndiEventWait(api->ThreadBufferEvent, 5000))
    {
      ndiSetError(api, NDI_TIMEOUT);
      return commandReply;
    }
    // copy the thread's reply buffer into the main reply buffer
    ndiMutexLock(api->ThreadBufferMutex);
    for (bytes = 0; api->ThreadBuffer[bytes] != '\0'; bytes++)
    {
      reply[bytes] = api->ThreadBuffer[bytes];
    }
    if (!isBinary)
    {
      reply[bytes] = '\0';   // terminate string
    }
    errorCode = api->ThreadErrorCode;
    ndiMutexUnlock(api->ThreadBufferMutex);

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }
  // if the command is not a GX or thread_mode is not on, then
  //   send the command directly to the Measurement System and get a reply
  else
  {
    bool isThreadMode = api->IsThreadedMode;

    if (isThreadMode && api->IsTracking)
    {
      // block the tracking thread while we slip this command through
      ndiMutexLock(api->ThreadMutex);
    }

    // change pol->tracking if either TSTOP or TSTART is sent
    if ((commandLength == 5 && strncmp(command, "TSTOP", commandLength) == 0) ||
        (commandLength == 4 && strncmp(command, "INIT", commandLength) == 0))
    {
      api->IsTracking = false;
    }
    else if (commandLength == 6 && strncmp(command, "TSTART", commandLength) == 0)
    {
      api->IsTracking = true;
      if (isThreadMode)
      {
        // this will force the thread to wait until the application sends the first GX command
        api->ThreadCommand[0] = '\0';
      }
    }

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      // flush the input buffer, because anything that we haven't read
      //   yet is garbage left over by a previously failed command
      ndiSerialFlush(api->SerialDevice, NDI_IFLUSH);
    }
    else
    {
      ndiSocketFlush(api->Socket, NDI_IFLUSH);
    }

    // send the command to the Measurement System
    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      bytes = ndiSerialWrite(api->SerialDevice, command, i);
    }
    else
    {
      bytes = ndiSocketWrite(api->Socket, command, i);
    }
    if (bytes < 0)
    {
      errorCode = NDI_WRITE_ERROR;
    }
    else if (bytes < i)
    {
      errorCode = NDI_TIMEOUT;
    }

    // read the reply from the Measurement System
    bytes = 0;
    if (errorCode == 0)
    {
      if (api->SerialDevice != NDI_INVALID_HANDLE)
      {
        bytes = ndiSerialRead(api->SerialDevice, reply, 2047, isBinary, &errorCode);
      }
      else
      {
        bytes = ndiSocketRead(api->Socket, reply, 2047, isBinary, &errorCode);
      }
      if (bytes < 0)
      {
        errorCode = NDI_READ_ERROR;
        bytes = 0;
      }
      else if (bytes == 0)
      {
        errorCode = NDI_TIMEOUT;
      }
      if (!isBinary)
      {
        reply[bytes] = '\0';   // terminate string
      }
    }

    if (isThreadMode & api->IsTracking)
    {
      // unblock the tracking thread
      ndiMutexUnlock(api->ThreadMutex);
    }

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }

  // back up to before the CRC
  if (!isBinary)
  {
    bytes -= 5; // 4 ASCII chars
  }
  else
  {
    bytes -= 2; // 2 bytes (unsigned short)
  }
  if (bytes < 0)
  {
    ndiSetError(api, NDI_BAD_CRC);
    return commandReply;
  }

  // calculate the CRC and copy serial_reply to command_reply
  CRC16 = 0;
  for (i = 0; i < bytes; i++)
  {
    CalcCRC16(reply[i], &CRC16);
    commandReply[i] = reply[i];
  }

  if (!isBinary)
  {
    // terminate command_reply before the CRC
    commandReply[i] = '\0';
  }

  if (errorCode != 0)
  {
    // Any above errors are caught here and returned after the command has had its CRC stripped
    return commandReply;
  }

  if (!isBinary)
  {
    // read and check the CRC value of the reply
    if (CRC16 != ndiHexToUnsignedLong(&reply[bytes], 4))
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }
  else
  {
    unsigned short replyCrc = (unsigned char)reply[bytes + 1] << 8 | (unsigned char)reply[bytes];
    if (replyCrc != CRC16)
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }

  // check for error code
  if (commandReply[0] == 'E' && strncmp(commandReply, "ERROR", 5) == 0)
  {
    ndiSetError(api, ndiHexToUnsignedLong(&commandReply[5], 2));
    return commandReply;
  }

  // special behavior for specific commands
  if (command[0] == 'T' && command[1] == 'X' && commandLength == 2)   // the TX command
  {
    ndiTXHelper(api, command, commandReply);
  }
  else if (command[0] == 'B' && command[1] == 'X' && commandLength == 2)   // the BX command
  {
    ndiBXHelper(api, command, commandReply);
  }
  else if (command[0] == 'G' && command[1] == 'X' && commandLength == 2)   // the GX command
  {
    ndiGXHelper(api, command, commandReply);
  }
  else if (command[0] == 'C' && commandLength == 4 && strncmp(command, "COMM", commandLength) == 0)
  {
    ndiCOMMHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 4 && strncmp(command, "INIT", commandLength) == 0)
  {
    ndiINITHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 5 && strncmp(command, "IRCHK", commandLength) == 0)
  {
    ndiIRCHKHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PHINF", commandLength) == 0)
  {
    ndiPHINFHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHRQ", commandLength) == 0)
  {
    ndiPHRQHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHSR", commandLength) == 0)
  {
    ndiPHSRHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PSTAT", commandLength) == 0)
  {
    ndiPSTATHelper(api, command, commandReply);
  }
  else if (command[0] == 'S' && commandLength == 5 && strncmp(command, "SSTAT", commandLength) == 0)
  {
    ndiSSTATHelper(api, command, commandReply);
  }

  // return the Measurement System reply, but with the CRC hacked off
  return commandReply;
}